

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fees.cpp
# Opt level: O2

double __thiscall
CBlockPolicyEstimator::estimateConservativeFee
          (CBlockPolicyEstimator *this,uint doubleTarget,EstimationResult *result)

{
  TxConfirmStats *pTVar1;
  long lVar2;
  EstimationResult *pEVar3;
  long in_FS_OFFSET;
  byte bVar4;
  double dVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  EstimationResult local_98;
  long local_28;
  
  bVar4 = 0;
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_98.pass.start = -1.0;
  local_98.pass.end = -1.0;
  local_98.pass.withinTarget = 0.0;
  local_98.pass.totalConfirmed = 0.0;
  local_98.pass.inMempool = 0.0;
  local_98.pass.leftMempool = 0.0;
  local_98.fail.start = -1.0;
  local_98.fail.end = -1.0;
  local_98.fail.withinTarget = 0.0;
  local_98.fail.totalConfirmed = 0.0;
  local_98.fail.inMempool = 0.0;
  local_98.fail.leftMempool._0_4_ = 0;
  local_98.fail.leftMempool._4_4_ = 0;
  local_98.decay._0_4_ = 0;
  local_98._100_8_ = 0;
  pTVar1 = (this->shortStats)._M_t.
           super___uniq_ptr_impl<TxConfirmStats,_std::default_delete<TxConfirmStats>_>._M_t.
           super__Tuple_impl<0UL,_TxConfirmStats_*,_std::default_delete<TxConfirmStats>_>.
           super__Head_base<0UL,_TxConfirmStats_*,_false>._M_head_impl;
  if ((int)(((long)*(pointer *)
                    ((long)&(pTVar1->confAvg).
                            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    + 8) -
            *(long *)&(pTVar1->confAvg).
                      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      ._M_impl) / 0x18) * pTVar1->scale < doubleTarget) {
    uVar6 = 0;
    uVar7 = 0xbff00000;
  }
  else {
    dVar5 = TxConfirmStats::EstimateMedianVal
                      ((this->feeStats)._M_t.
                       super___uniq_ptr_impl<TxConfirmStats,_std::default_delete<TxConfirmStats>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_TxConfirmStats_*,_std::default_delete<TxConfirmStats>_>
                       .super__Head_base<0UL,_TxConfirmStats_*,_false>._M_head_impl,doubleTarget,0.1
                       ,0.95,this->nBestSeenHeight,result);
    uVar6 = SUB84(dVar5,0);
    uVar7 = (undefined4)((ulong)dVar5 >> 0x20);
  }
  pTVar1 = (this->feeStats)._M_t.
           super___uniq_ptr_impl<TxConfirmStats,_std::default_delete<TxConfirmStats>_>._M_t.
           super__Tuple_impl<0UL,_TxConfirmStats_*,_std::default_delete<TxConfirmStats>_>.
           super__Head_base<0UL,_TxConfirmStats_*,_false>._M_head_impl;
  if (doubleTarget <=
      (int)(((long)*(pointer *)
                    ((long)&(pTVar1->confAvg).
                            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    + 8) -
            *(long *)&(pTVar1->confAvg).
                      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      ._M_impl) / 0x18) * pTVar1->scale) {
    dVar5 = TxConfirmStats::EstimateMedianVal
                      ((this->longStats)._M_t.
                       super___uniq_ptr_impl<TxConfirmStats,_std::default_delete<TxConfirmStats>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_TxConfirmStats_*,_std::default_delete<TxConfirmStats>_>
                       .super__Head_base<0UL,_TxConfirmStats_*,_false>._M_head_impl,doubleTarget,0.1
                       ,0.95,this->nBestSeenHeight,&local_98);
    if ((double)CONCAT44(uVar7,uVar6) < dVar5) {
      if (result != (EstimationResult *)0x0) {
        pEVar3 = &local_98;
        for (lVar2 = 0x6c; lVar2 != 0; lVar2 = lVar2 + -1) {
          *(undefined1 *)&(result->pass).start = *(undefined1 *)&(pEVar3->pass).start;
          pEVar3 = (EstimationResult *)((long)pEVar3 + (ulong)bVar4 * -2 + 1);
          result = (EstimationResult *)((long)result + (ulong)bVar4 * -2 + 1);
        }
      }
      uVar6 = SUB84(dVar5,0);
      uVar7 = (undefined4)((ulong)dVar5 >> 0x20);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return (double)CONCAT44(uVar7,uVar6);
  }
  __stack_chk_fail();
}

Assistant:

double CBlockPolicyEstimator::estimateConservativeFee(unsigned int doubleTarget, EstimationResult *result) const
{
    double estimate = -1;
    EstimationResult tempResult;
    if (doubleTarget <= shortStats->GetMaxConfirms()) {
        estimate = feeStats->EstimateMedianVal(doubleTarget, SUFFICIENT_FEETXS, DOUBLE_SUCCESS_PCT, nBestSeenHeight, result);
    }
    if (doubleTarget <= feeStats->GetMaxConfirms()) {
        double longEstimate = longStats->EstimateMedianVal(doubleTarget, SUFFICIENT_FEETXS, DOUBLE_SUCCESS_PCT, nBestSeenHeight, &tempResult);
        if (longEstimate > estimate) {
            estimate = longEstimate;
            if (result) *result = tempResult;
        }
    }
    return estimate;
}